

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

void Amap_ManCreateXorChoices
               (Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1,Amap_Obj_t **pChoices)

{
  Amap_Obj_t *pAVar1;
  Amap_Obj_t *pFan1_00;
  Amap_Obj_t **pChoices_local;
  Amap_Obj_t *pFan1_local;
  Amap_Obj_t *pFan0_local;
  Amap_Man_t *p_local;
  
  pAVar1 = Amap_ManCreateXor(p,pFan0,pFan1);
  *pChoices = pAVar1;
  pAVar1 = Amap_Not(pFan0);
  pAVar1 = Amap_ManCreateXor(p,pAVar1,pFan1);
  pChoices[1] = pAVar1;
  pAVar1 = Amap_Not(pFan1);
  pAVar1 = Amap_ManCreateXor(p,pFan0,pAVar1);
  pChoices[2] = pAVar1;
  pAVar1 = Amap_Not(pFan0);
  pFan1_00 = Amap_Not(pFan1);
  pAVar1 = Amap_ManCreateXor(p,pAVar1,pFan1_00);
  pChoices[3] = pAVar1;
  return;
}

Assistant:

void Amap_ManCreateXorChoices( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1, Amap_Obj_t * pChoices[] )
{
    pChoices[0] = Amap_ManCreateXor( p, pFan0,           pFan1 );
    pChoices[1] = Amap_ManCreateXor( p, Amap_Not(pFan0), pFan1 );
    pChoices[2] = Amap_ManCreateXor( p, pFan0,           Amap_Not(pFan1) );
    pChoices[3] = Amap_ManCreateXor( p, Amap_Not(pFan0), Amap_Not(pFan1) );
}